

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

int Gia_ManSetFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  Vec_Int_t *pVVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  
  if (pAig->vCis->nSize - pAig->nRegs != p->nPis) {
    __assert_fail("Gia_ManPiNum(pAig) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x8b,"int Gia_ManSetFailedPoCex(Gia_Man_t *, Abc_Cex_t *)");
  }
  Gia_ManCleanMark0(pAig);
  p->iPo = -1;
  if (-1 < p->iFrame) {
    uVar6 = p->nRegs;
    iVar7 = pAig->nRegs;
    iVar9 = 0;
    do {
      pVVar11 = pAig->vCis;
      uVar14 = (ulong)(uint)pVVar11->nSize;
      if (iVar7 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          if ((int)uVar14 <= lVar10) goto LAB_00661b71;
          lVar13 = (long)pVVar11->pArray[lVar10];
          if ((lVar13 < 0) || (iVar7 = pAig->nObjs, iVar7 <= pVVar11->pArray[lVar10]))
          goto LAB_00661b52;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) {
            uVar6 = uVar6 + (int)lVar10;
            goto LAB_006618e1;
          }
          *(ulong *)(pGVar3 + lVar13) =
               *(ulong *)(pGVar3 + lVar13) & 0xffffffffbfffffff |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar6 + lVar10) >> 5] >>
                        ((byte)((ulong)uVar6 + lVar10) & 0x1f) & 1) << 0x1e);
          lVar10 = lVar10 + 1;
          pVVar11 = pAig->vCis;
          uVar14 = (ulong)pVVar11->nSize;
        } while (lVar10 < (long)(uVar14 - (long)pAig->nRegs));
        uVar6 = uVar6 + (int)lVar10;
      }
      iVar7 = pAig->nObjs;
      if (0 < iVar7) {
LAB_006618e1:
        lVar10 = 0;
        lVar13 = 0;
        do {
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar14 = *(ulong *)(&pGVar3->field_0x0 + lVar10);
          if ((uVar14 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            *(ulong *)(&pGVar3->field_0x0 + lVar10) =
                 uVar14 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar14 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar14 >> 0x1e) & 0x7ffffffc) * -3 + lVar10) >>
                          0x1e) & ((uint)(uVar14 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar14 & 0x1fffffff) << 2) * -3 +
                                           lVar10) >> 0x1e) & 1) << 0x1e);
            iVar7 = pAig->nObjs;
          }
          lVar13 = lVar13 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar13 < iVar7);
      }
      pVVar11 = pAig->vCos;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          iVar7 = pVVar11->pArray[lVar10];
          if (((long)iVar7 < 0) || (pAig->nObjs <= iVar7)) goto LAB_00661b52;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pAig->pObjs + iVar7;
          uVar8 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar8 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar8 & 0x1fffffff))) & 0x40000000);
          lVar10 = lVar10 + 1;
          pVVar11 = pAig->vCos;
        } while (lVar10 < pVVar11->nSize);
      }
      iVar7 = pAig->nRegs;
      if (0 < iVar7) {
        iVar12 = 0;
        do {
          pVVar11 = pAig->vCos;
          uVar8 = (pVVar11->nSize - iVar7) + iVar12;
          if (((int)uVar8 < 0) || (pVVar11->nSize <= (int)uVar8)) goto LAB_00661b71;
          iVar1 = pVVar11->pArray[uVar8];
          if (((long)iVar1 < 0) || (pAig->nObjs <= iVar1)) goto LAB_00661b52;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) goto LAB_00661ac5;
          iVar2 = pAig->vCis->nSize;
          uVar8 = (iVar2 - iVar7) + iVar12;
          if (((int)uVar8 < 0) || (iVar2 <= (int)uVar8)) goto LAB_00661b71;
          uVar8 = pAig->vCis->pArray[uVar8];
          lVar10 = (long)(int)uVar8;
          if ((lVar10 < 0) || ((uint)pAig->nObjs <= uVar8)) goto LAB_00661b52;
          *(ulong *)(pGVar3 + lVar10) =
               *(ulong *)(pGVar3 + lVar10) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar1) & 0x40000000);
          iVar12 = iVar12 + 1;
          iVar7 = pAig->nRegs;
        } while (iVar12 < iVar7);
        pVVar11 = pAig->vCos;
      }
LAB_00661ac5:
      uVar8 = pVVar11->nSize;
      if (uVar8 - iVar7 != 0 && iVar7 <= (int)uVar8) {
        uVar5 = uVar8;
        if ((int)uVar8 < 1) {
          uVar5 = 0;
        }
        uVar14 = 0;
        do {
          if (uVar5 == uVar14) {
LAB_00661b71:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar12 = pVVar11->pArray[uVar14];
          if (((long)iVar12 < 0) || (pAig->nObjs <= iVar12)) {
LAB_00661b52:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          if ((pAig->pObjs[iVar12].field_0x3 & 0x40) != 0) {
            p->iPo = (int)uVar14;
            p->iFrame = iVar9;
            p->nBits = uVar6;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar8 - iVar7 != uVar14);
      }
      bVar4 = iVar9 < p->iFrame;
      iVar9 = iVar9 + 1;
    } while (bVar4);
  }
  Gia_ManCleanMark0(pAig);
  return p->iPo;
}

Assistant:

int Gia_ManSetFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
    p->iPo = -1;
//    Gia_ManForEachRo( pAig, pObj, i )
//       pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        // check the POs
        Gia_ManForEachPo( pAig, pObj, k )
	    {
            if ( !pObj->fMark0 )
                continue;
            p->iPo = k;
            p->iFrame = i;
            p->nBits = iBit;
            break;
	    }
    }
    Gia_ManCleanMark0(pAig);
    return p->iPo;
}